

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_path.cpp
# Opt level: O2

void duckdb::TrimPathFunction<true>(DataChunk *args,ExpressionState *state,Vector *result)

{
  long lVar1;
  anon_union_16_2_67f50693_for_value *paVar2;
  long *plVar3;
  reference pvVar4;
  UnifiedVectorFormat *pUVar5;
  TemplatedValidityMask<unsigned_long> *this;
  UnifiedVectorFormat *pUVar6;
  UnifiedVectorFormat *pUVar7;
  undefined1 in_R9B;
  UnifiedVectorFormat *pUVar8;
  undefined8 *puVar9;
  string_t a;
  string_t b;
  string_t b_00;
  string_t sVar10;
  anon_struct_16_3_d7536bce_for_pointer aVar11;
  UnifiedVectorFormat *idx;
  UnifiedVectorFormat adata;
  undefined7 uStack_1e7;
  long local_1e0;
  long local_1d8;
  UnifiedVectorFormat bdata;
  long local_198;
  long local_190;
  long *local_158 [2];
  long local_148;
  Vector trim_extension;
  byte *local_e8;
  Vector separator;
  anon_union_16_2_67f50693_for_value *local_88;
  byte *local_80;
  anon_union_16_2_67f50693_for_value local_40;
  
  pvVar4 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,0);
  string_t::string_t((string_t *)&local_40.pointer,"default");
  duckdb::Value::Value((Value *)&trim_extension,(string_t)local_40);
  duckdb::Vector::Vector(&separator,(Value *)&trim_extension);
  duckdb::Value::~Value((Value *)&trim_extension);
  duckdb::Value::BOOLEAN(SUB81(&adata,0));
  duckdb::Vector::Vector(&trim_extension,(Value *)&adata);
  duckdb::Value::~Value((Value *)&adata);
  adata = (UnifiedVectorFormat)0x1;
  ReadOptionalArgs(args,&separator,&trim_extension,(bool *)&adata);
  idx = *(UnifiedVectorFormat **)(args + 0x18);
  if (((*pvVar4 == (value_type)0x2) && (separator == (Vector)0x2)) &&
     (trim_extension == (Vector)0x2)) {
    duckdb::Vector::SetVectorType((VectorType)result);
    if ((((*(byte **)(pvVar4 + 0x28) == (byte *)0x0) || ((**(byte **)(pvVar4 + 0x28) & 1) != 0)) &&
        ((local_80 == (byte *)0x0 || ((*local_80 & 1) != 0)))) &&
       ((local_e8 == (byte *)0x0 || ((*local_e8 & 1) != 0)))) {
      paVar2 = *(anon_union_16_2_67f50693_for_value **)(result + 0x20);
      aVar11 = (anon_struct_16_3_d7536bce_for_pointer)
               TernaryLambdaWrapper::
               Operation<duckdb::TrimPathFunction<true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t&,duckdb::string_t,bool)_1_,duckdb::string_t,duckdb::string_t,bool,duckdb::string_t>
                         ((anon_class_8_1_6971b95b)result,
                          (string_t)
                          (*(anon_union_16_2_67f50693_for_value **)(pvVar4 + 0x20))->pointer,
                          (string_t)local_88->pointer,(bool)in_R9B,(ValidityMask *)result,(idx_t)idx
                         );
      paVar2->pointer = aVar11;
    }
    else {
      duckdb::ConstantVector::SetNull(result,true);
    }
  }
  else {
    duckdb::Vector::SetVectorType((VectorType)result);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&adata);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&bdata);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_158);
    duckdb::Vector::ToUnifiedFormat((ulong)pvVar4,idx);
    duckdb::Vector::ToUnifiedFormat((ulong)&separator,idx);
    duckdb::Vector::ToUnifiedFormat((ulong)&trim_extension,idx);
    plVar3 = (long *)CONCAT71(uStack_1e7,adata);
    lVar1 = *(long *)(result + 0x20);
    FlatVector::VerifyFlatVector(result);
    if (((local_1d8 == 0) && (local_190 == 0)) && (local_148 == 0)) {
      puVar9 = (undefined8 *)(lVar1 + 8);
      for (pUVar8 = (UnifiedVectorFormat *)0x0; idx != pUVar8; pUVar8 = pUVar8 + 1) {
        lVar1 = *plVar3;
        pUVar5 = pUVar8;
        if (lVar1 != 0) {
          pUVar5 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar1 + (long)pUVar8 * 4);
        }
        pUVar7 = pUVar8;
        if (*_bdata != 0) {
          pUVar7 = (UnifiedVectorFormat *)(ulong)*(uint *)(*_bdata + (long)pUVar8 * 4);
        }
        a.value.pointer.ptr = (char *)*(undefined8 *)(local_1e0 + 8 + (long)pUVar5 * 0x10);
        a.value._0_8_ = *(undefined8 *)(local_1e0 + (long)pUVar5 * 0x10);
        b.value.pointer.ptr = (char *)*(undefined8 *)(local_198 + 8 + (long)pUVar7 * 0x10);
        b.value._0_8_ = *(undefined8 *)(local_198 + (long)pUVar7 * 0x10);
        sVar10 = TernaryLambdaWrapper::
                 Operation<duckdb::TrimPathFunction<true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t&,duckdb::string_t,bool)_1_,duckdb::string_t,duckdb::string_t,bool,duckdb::string_t>
                           ((anon_class_8_1_6971b95b)result,a,b,(bool)in_R9B,(ValidityMask *)result,
                            (idx_t)idx);
        puVar9[-1] = sVar10.value._0_8_;
        *puVar9 = sVar10.value._8_8_;
        puVar9 = puVar9 + 2;
      }
    }
    else {
      this = (TemplatedValidityMask<unsigned_long> *)(result + 0x28);
      puVar9 = (undefined8 *)(lVar1 + 8);
      for (pUVar8 = (UnifiedVectorFormat *)0x0; idx != pUVar8; pUVar8 = pUVar8 + 1) {
        lVar1 = *plVar3;
        pUVar5 = pUVar8;
        if (lVar1 != 0) {
          pUVar5 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar1 + (long)pUVar8 * 4);
        }
        pUVar7 = pUVar8;
        if (*_bdata != 0) {
          pUVar7 = (UnifiedVectorFormat *)(ulong)*(uint *)(*_bdata + (long)pUVar8 * 4);
        }
        pUVar6 = pUVar8;
        if (*local_158[0] != 0) {
          pUVar6 = (UnifiedVectorFormat *)(ulong)*(uint *)(*local_158[0] + (long)pUVar8 * 4);
        }
        if (((local_1d8 == 0) ||
            ((*(ulong *)(local_1d8 + ((ulong)pUVar5 >> 6) * 8) >> ((ulong)pUVar5 & 0x3f) & 1) != 0))
           && (((local_190 == 0 ||
                ((*(ulong *)(local_190 + ((ulong)pUVar7 >> 6) * 8) >> ((ulong)pUVar7 & 0x3f) & 1) !=
                 0)) && ((local_148 == 0 ||
                         ((*(ulong *)(local_148 + ((ulong)pUVar6 >> 6) * 8) >>
                           ((ulong)pUVar6 & 0x3f) & 1) != 0)))))) {
          sVar10.value.pointer.ptr = (char *)*(undefined8 *)(local_1e0 + 8 + (long)pUVar5 * 0x10);
          sVar10.value._0_8_ = *(undefined8 *)(local_1e0 + (long)pUVar5 * 0x10);
          b_00.value.pointer.ptr = (char *)*(undefined8 *)(local_198 + 8 + (long)pUVar7 * 0x10);
          b_00.value._0_8_ = *(undefined8 *)(local_198 + (long)pUVar7 * 0x10);
          sVar10 = TernaryLambdaWrapper::
                   Operation<duckdb::TrimPathFunction<true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t&,duckdb::string_t,bool)_1_,duckdb::string_t,duckdb::string_t,bool,duckdb::string_t>
                             ((anon_class_8_1_6971b95b)result,sVar10,b_00,(bool)in_R9B,
                              (ValidityMask *)result,(idx_t)idx);
          puVar9[-1] = sVar10.value._0_8_;
          *puVar9 = sVar10.value._8_8_;
        }
        else {
          TemplatedValidityMask<unsigned_long>::SetInvalid(this,(idx_t)pUVar8);
        }
        puVar9 = puVar9 + 2;
      }
    }
    UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)local_158);
    UnifiedVectorFormat::~UnifiedVectorFormat(&bdata);
    UnifiedVectorFormat::~UnifiedVectorFormat(&adata);
  }
  Vector::~Vector(&trim_extension);
  Vector::~Vector(&separator);
  return;
}

Assistant:

static void TrimPathFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	// set default values
	Vector &path = args.data[0];
	Vector separator(string_t("default"));
	Vector trim_extension(Value::BOOLEAN(false));
	ReadOptionalArgs(args, separator, trim_extension, FRONT_TRIM);

	TernaryExecutor::Execute<string_t, string_t, bool, string_t>(
	    path, separator, trim_extension, result, args.size(),
	    [&](string_t &inputs, string_t input_sep, bool trim_extension) {
		    auto data = inputs.GetData();
		    auto input_size = inputs.GetSize();
		    auto sep = GetSeparator(input_sep.GetString());

		    // find the beginning idx and the size of the result string
		    idx_t begin = 0;
		    idx_t new_size = input_size;
		    if (FRONT_TRIM) { // left trim
			    auto pos = Find(data, input_size, sep);
			    if (pos == 0) { // path starts with separator
				    pos = 1;
			    }
			    new_size = (IsIdxValid(pos, input_size)) ? pos : 0;
		    } else { // right trim
			    auto idx_last_sep = FindLast(data, input_size, sep);
			    if (IsIdxValid(idx_last_sep, input_size)) {
				    begin = idx_last_sep + 1;
			    }
			    if (trim_extension) {
				    auto idx_extension_sep = FindLast(data, input_size, ".");
				    if (begin <= idx_extension_sep && IsIdxValid(idx_extension_sep, input_size)) {
					    new_size = idx_extension_sep;
				    }
			    }
		    }
		    // copy the trimmed string
		    D_ASSERT(begin <= new_size);
		    auto target = StringVector::EmptyString(result, new_size - begin);
		    auto output = target.GetDataWriteable();
		    memcpy(output, data + begin, new_size - begin);

		    target.Finalize();
		    return target;
	    });
}